

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cmd.cpp
# Opt level: O3

void FS_EmulateCmd(char *string)

{
  bool *pbVar1;
  long lVar2;
  char *__s1;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  UCVarValue value;
  UCVarValue value_00;
  FScanner sc;
  char buffer [80];
  FScanner local_188;
  char local_88 [88];
  
  FScanner::FScanner(&local_188);
  sVar5 = strlen(string);
  FScanner::OpenMem(&local_188,"RUNCMD",string,(int)sVar5);
LAB_006b3f6f:
  do {
    while( true ) {
      bVar3 = FScanner::GetString(&local_188);
      if (!bVar3) {
        FScanner::~FScanner(&local_188);
        return;
      }
      bVar3 = FScanner::Compare(&local_188,"GIMME");
      if (!bVar3) break;
      while ((bVar3 = FScanner::GetString(&local_188), bVar3 &&
             (bVar3 = FScanner::Compare(&local_188,";"), __s1 = local_188.String, !bVar3))) {
        iVar4 = strncasecmp(local_188.String,"health",6);
        pcVar7 = "health";
        if (iVar4 == 0) goto LAB_006b41d3;
        iVar4 = strncasecmp(__s1,"ammo",4);
        pcVar7 = "ammo";
        if (iVar4 == 0) goto LAB_006b41d3;
        iVar4 = strncasecmp(__s1,"armor",5);
        pcVar7 = "greenarmor";
        if (iVar4 == 0) goto LAB_006b41d3;
        iVar4 = strncasecmp(__s1,"keys",4);
        pcVar7 = "keys";
        if (iVar4 == 0) goto LAB_006b41d3;
        iVar4 = strncasecmp(__s1,"weapons",7);
        pcVar7 = "weapons";
        if (iVar4 == 0) goto LAB_006b41d3;
        iVar4 = strncasecmp(__s1,"chainsaw",8);
        pcVar7 = "chainsaw";
        if (iVar4 == 0) goto LAB_006b41d3;
        iVar4 = strncasecmp(__s1,"shotgun",7);
        pcVar7 = "shotgun";
        if (iVar4 == 0) goto LAB_006b41d3;
        iVar4 = strncasecmp(__s1,"supershotgun",0xc);
        pcVar7 = "supershotgun";
        if (iVar4 == 0) goto LAB_006b41d3;
        iVar4 = strncasecmp(__s1,"rocket",6);
        pcVar7 = "rocketlauncher";
        if (iVar4 == 0) goto LAB_006b41d3;
        iVar4 = strncasecmp(__s1,"plasma",6);
        pcVar7 = "plasmarifle";
        if (iVar4 == 0) goto LAB_006b41d3;
        iVar4 = strncasecmp(__s1,"bfg",3);
        pcVar7 = "BFG9000";
        if (iVar4 == 0) goto LAB_006b41d3;
        iVar4 = strncasecmp(__s1,"chaingun",8);
        pcVar7 = "chaingun";
        if (iVar4 == 0) goto LAB_006b41d3;
        iVar4 = strncasecmp(__s1,"berserk",7);
        pcVar7 = "Berserk";
        if (iVar4 == 0) goto LAB_006b41d3;
        iVar4 = strncasecmp(__s1,"map",3);
        pcVar7 = "Allmap";
        if (iVar4 == 0) goto LAB_006b41d3;
        iVar4 = strncasecmp(__s1,"fullmap",7);
        pcVar7 = "Allmap";
        if (iVar4 == 0) {
LAB_006b41d3:
          mysnprintf(local_88,0x50,"give %.72s",pcVar7);
          AddCommandString(local_88,0);
        }
      }
    }
    bVar3 = FScanner::Compare(&local_188,"ALLOWJUMP");
    if (bVar3) {
      FScanner::MustGetNumber(&local_188);
      if (local_188.Number == 0) {
        value_00._0_4_ = dmflags.Value | 0x10000;
        value_00._4_4_ = 0;
        FBaseCVar::SetGenericRep(&dmflags.super_FBaseCVar,value_00,CVAR_Int);
      }
      else {
        value._0_4_ = dmflags.Value & 0xfffeffff;
        value._4_4_ = 0;
        FBaseCVar::SetGenericRep(&dmflags.super_FBaseCVar,value,CVAR_Int);
      }
      do {
        bVar3 = FScanner::GetString(&local_188);
        if (!bVar3) break;
        bVar3 = FScanner::Compare(&local_188,";");
      } while (!bVar3);
      goto LAB_006b3f6f;
    }
    bVar3 = FScanner::Compare(&local_188,"gravity");
    if (bVar3) {
      FScanner::MustGetFloat(&local_188);
      level.gravity = (double)(float)(local_188.Float * 800.0);
      do {
        bVar3 = FScanner::GetString(&local_188);
        if (!bVar3) break;
        bVar3 = FScanner::Compare(&local_188,";");
      } while (!bVar3);
    }
    else {
      bVar3 = FScanner::Compare(&local_188,"viewheight");
      if (bVar3) {
        FScanner::MustGetFloat(&local_188);
        lVar6 = 0x1d0;
        do {
          lVar2 = *(long *)((long)&gameskill.super_FBaseCVar._vptr_FBaseCVar + lVar6);
          if (lVar2 != 0) {
            *(double *)(lVar2 + 0x4e0) = local_188.Float;
          }
          *(double *)((long)&chasedemo.super_FBaseCVar.Name + lVar6) = local_188.Float;
          if ((*(double *)(&noblit + lVar6) != 1.0) || (NAN(*(double *)(&noblit + lVar6)))) {
            pbVar1 = &noblit + lVar6;
            pbVar1[0] = false;
            pbVar1[1] = false;
            pbVar1[2] = false;
            pbVar1[3] = false;
            pbVar1[4] = false;
            pbVar1[5] = false;
            pbVar1[6] = true;
            pbVar1[7] = true;
            *(undefined2 *)((long)&nametagcolor.super_FBaseCVar.Name + lVar6 + 2) = 0;
            *(undefined8 *)((long)&players + lVar6) = 0;
            *(undefined8 *)(&DAT_00a60298 + lVar6) = 0;
            *(undefined8 *)((long)&chasedemo.super_FBaseCVar.Name + lVar6) =
                 *(undefined8 *)(lVar2 + 0x4e0);
          }
          lVar6 = lVar6 + 0x2a0;
        } while (lVar6 != 0x16d0);
        do {
          bVar3 = FScanner::GetString(&local_188);
          if (!bVar3) break;
          bVar3 = FScanner::Compare(&local_188,";");
        } while (!bVar3);
      }
      else {
        bVar3 = FScanner::Compare(&local_188,"map");
        if (bVar3) {
          FS_MapCmd(&local_188);
        }
        else {
          bVar3 = FScanner::Compare(&local_188,"gr_fogdensity");
          if (bVar3) {
            FScanner::MustGetNumber(&local_188);
            (*Renderer->_vptr_FRenderer[0x15])
                      (Renderer,(ulong)(uint)((local_188.Number * 0x46) / 400),0xff000000,0,0);
          }
          else {
            bVar3 = FScanner::Compare(&local_188,"gr_fogcolor");
            if (bVar3) {
              FScanner::MustGetString(&local_188);
              lVar6 = strtol(local_188.String,(char **)0x0,0x10);
              level.fadeto = (DWORD)lVar6;
            }
            else {
              do {
                bVar3 = FScanner::GetString(&local_188);
                if (!bVar3) break;
                bVar3 = FScanner::Compare(&local_188,";");
              } while (!bVar3);
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

void FS_EmulateCmd(char * string)
{
	FScanner sc;
	sc.OpenMem("RUNCMD", string, (int)strlen(string));
	while (sc.GetString())
	{
		if (sc.Compare("GIMME"))
		{
			while (sc.GetString())
			{
				if (!sc.Compare(";")) FS_Gimme(sc.String);
				else break;
			}
		}
		else if (sc.Compare("ALLOWJUMP"))
		{
			sc.MustGetNumber();
			if (sc.Number) dmflags = dmflags & ~DF_NO_JUMP;
			else dmflags=dmflags | DF_NO_JUMP;
			while (sc.GetString())
			{
				if (sc.Compare(";")) break;
			}
		}
		else if (sc.Compare("gravity"))
		{
			sc.MustGetFloat();
			level.gravity=(float)(sc.Float*800);
			while (sc.GetString())
			{
				if (sc.Compare(";")) break;
			}
		}
		else if (sc.Compare("viewheight"))
		{
			sc.MustGetFloat();
			double playerviewheight = sc.Float;
			for(int i=0;i<MAXPLAYERS;i++)
			{
				// No, this is not correct. But this is the way Legacy WADs expect it to be handled!
				if (players[i].mo != NULL) players[i].mo->ViewHeight = playerviewheight;
				players[i].viewheight = playerviewheight;
				players[i].Uncrouch();
			}
			while (sc.GetString())
			{
				if (sc.Compare(";")) break;
			}
		}
		else if (sc.Compare("map"))
		{
			FS_MapCmd(sc);
		}
		else if (sc.Compare("gr_fogdensity"))
		{
			sc.MustGetNumber();
			// Using this disables most MAPINFO fog options!
			Renderer->SetFogParams(sc.Number*70/400, 0xff000000, 0, 0);
		}
		else if (sc.Compare("gr_fogcolor"))
		{
			sc.MustGetString();
			level.fadeto = strtol(sc.String, NULL, 16);
		}

		else
		{
			// Skip unhandled commands
			while (sc.GetString())
			{
				if (sc.Compare(";")) break;
			}
		}
	}
}